

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

Constraint *
slang::ast::ImplicationConstraint::fromSyntax
          (ImplicationConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ASTContext *pAVar3;
  InvalidConstraint *pIVar4;
  socklen_t __len;
  ConstraintExprVisitor *args_00;
  ConstraintExprVisitor local_40;
  Expression *args;
  
  this = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->left).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  iVar2 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)context,__len);
  pAVar3 = (ASTContext *)
           BumpAllocator::
           emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
                     (&this->super_BumpAllocator,args,(Constraint *)CONCAT44(extraout_var_00,iVar2))
  ;
  bVar1 = Expression::bad(args);
  if ((bVar1) || (((Constraint *)CONCAT44(extraout_var_00,iVar2))->kind == Invalid)) {
    args_00 = &local_40;
  }
  else {
    local_40.failed = false;
    local_40.isTop = true;
    local_40.sawRandVars = false;
    local_40.isSoft = false;
    local_40.context = context;
    bVar1 = Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                      (args,args,&local_40);
    if (bVar1) {
      return (Constraint *)pAVar3;
    }
    args_00 = (ConstraintExprVisitor *)&stack0xffffffffffffffd0;
  }
  args_00->context = pAVar3;
  pIVar4 = BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                     (&this->super_BumpAllocator,(Constraint **)args_00);
  return &pIVar4->super_Constraint;
}

Assistant:

Constraint& ImplicationConstraint::fromSyntax(const ImplicationConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.left, context);
    auto& body = Constraint::bind(*syntax.constraints, context);
    auto result = comp.emplace<ImplicationConstraint>(pred, body);
    if (pred.bad() || body.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}